

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkBuildAccelerationStructureFlagsKHR
Diligent::BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  uint local_10;
  RAYTRACING_BUILD_AS_FLAGS FlagBit;
  VkBuildAccelerationStructureFlagsKHR Result;
  RAYTRACING_BUILD_AS_FLAGS Flags_local;
  
  local_10 = 0;
  FlagBit = Flags;
  while (FlagBit != RAYTRACING_BUILD_AS_NONE) {
    msg.field_2._M_local_buf[0xf] = ExtractLSB<Diligent::RAYTRACING_BUILD_AS_FLAGS>(&FlagBit);
    switch(msg.field_2._M_local_buf[0xf]) {
    case '\x01':
      local_10 = local_10 | 1;
      break;
    case '\x02':
      local_10 = local_10 | 2;
      break;
    default:
      FormatString<char[22]>((string *)local_38,(char (*) [22])"unknown build AS flag");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"BuildASFlagsToVkBuildAccelerationStructureFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x6db);
      std::__cxx11::string::~string((string *)local_38);
      break;
    case '\x04':
      local_10 = local_10 | 4;
      break;
    case '\b':
      local_10 = local_10 | 8;
      break;
    case '\x10':
      local_10 = local_10 | 0x10;
    }
  }
  return local_10;
}

Assistant:

VkBuildAccelerationStructureFlagsKHR BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)
{
    static_assert(RAYTRACING_BUILD_AS_FLAG_LAST == RAYTRACING_BUILD_AS_LOW_MEMORY,
                  "Please update the switch below to handle the new ray tracing build flag");

    VkBuildAccelerationStructureFlagsKHR Result = 0;
    while (Flags != RAYTRACING_BUILD_AS_NONE)
    {
        RAYTRACING_BUILD_AS_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_BUILD_AS_ALLOW_UPDATE:      Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_UPDATE_BIT_KHR;      break;
            case RAYTRACING_BUILD_AS_ALLOW_COMPACTION:  Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_COMPACTION_BIT_KHR;  break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_TRACE_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_BUILD: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_BUILD_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_LOW_MEMORY:        Result |= VK_BUILD_ACCELERATION_STRUCTURE_LOW_MEMORY_BIT_KHR;        break;
            // clang-format on
            default: UNEXPECTED("unknown build AS flag");
        }
    }
    return Result;
}